

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

void __thiscall
rangeless::fn::impl::
maybe<rangeless::fn::view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
::maybe(maybe<rangeless::fn::view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
        *this,maybe<rangeless::fn::view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>
              *other)

{
  view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
  *val;
  
  this->m_empty = true;
  if (other->m_empty != false) {
    return;
  }
  val = operator*(other);
  reset(this,val);
  reset(other);
  return;
}

Assistant:

maybe(maybe&& other) noexcept
        {        //^^ by value instead?
            if(!other.m_empty) {
                reset(std::move(*other));
                other.reset();
            }
        }